

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O0

int __thiscall ScapeGoatTree::addWithDepth(ScapeGoatTree *this,Node *node)

{
  bool bVar1;
  int local_30;
  int d;
  bool done;
  Node *w;
  Node *node_local;
  ScapeGoatTree *this_local;
  
  _d = this->root;
  if (_d == (Node *)0x0) {
    this->root = node;
    this->n = this->n + 1;
    this->q = this->q + 1;
    this_local._4_4_ = 0;
  }
  else {
    bVar1 = false;
    local_30 = 0;
    do {
      if (node->value < _d->value) {
        if (_d->leftChild == (Node *)0x0) {
          _d->leftChild = node;
          node->parent = _d;
          bVar1 = true;
        }
        else {
          _d = _d->leftChild;
        }
      }
      else {
        if (node->value <= _d->value) {
          return -1;
        }
        if (_d->rightChild == (Node *)0x0) {
          _d->rightChild = node;
          node->parent = _d;
          bVar1 = true;
        }
        else {
          _d = _d->rightChild;
        }
      }
      local_30 = local_30 + 1;
    } while (!bVar1);
    this->n = this->n + 1;
    this->q = this->q + 1;
    this_local._4_4_ = local_30;
  }
  return this_local._4_4_;
}

Assistant:

int ScapeGoatTree::addWithDepth(Node *node) {
    Node *w = root;
    if (w == nullptr) {
        root = node;
        n++;
        q++;
        return 0;
    }
    bool done = false;
    int d = 0;
    do {
        if (node->value < w->value) {
            if (w->leftChild == nullptr) {
                w->leftChild = node;
                node->parent = w;
                done = true;
            } else {
                w = w->leftChild;
            }
        } else if (node->value > w->value) {
            if (w->rightChild == nullptr) {
                w->rightChild = node;
                node->parent = w;
                done = true;
            } else {
                w = w->rightChild;
            }
        } else {
            return -1;
        }
        d++;
    } while (!done);

    n++;
    q++;
    return d;
}